

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

optional<tinyusdz::Token> * __thiscall
tinyusdz::crate::CrateReader::GetStringToken
          (optional<tinyusdz::Token> *__return_storage_ptr__,CrateReader *this,Index string_index)

{
  pointer pIVar1;
  ostream *poVar2;
  ostringstream ss_e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1e8;
  string local_1c8;
  Token local_1a8 [11];
  
  pIVar1 = (this->_string_indices).
           super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)string_index.value <
      (ulong)((long)(this->_string_indices).
                    super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 2)) {
    GetToken(__return_storage_ptr__,this,(Index)pIVar1[string_index.value].value);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"GetStringToken");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x9e);
    ::std::operator<<(poVar2," ");
    ::std::__cxx11::to_string(&local_1c8,string_index.value);
    ::std::operator+(&bStack_1e8,"String index out of range: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8
                    );
    poVar2 = ::std::operator<<((ostream *)local_1a8,(string *)&bStack_1e8);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    local_1a8[0].str_._M_dataplus._M_p = (pointer)&local_1a8[0].str_.field_2;
    local_1a8[0].str_._M_string_length = 0;
    local_1a8[0].str_.field_2._M_local_buf[0] = '\0';
    nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
              (__return_storage_ptr__,local_1a8);
    ::std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

const nonstd::optional<value::token> CrateReader::GetStringToken(
    crate::Index string_index) const {

  if (string_index.value < _string_indices.size()) {
    crate::Index s_idx = _string_indices[string_index.value];
    return GetToken(s_idx);
  } else {
    PUSH_ERROR("String index out of range: " +
               std::to_string(string_index.value));
    return value::token();
  }
}